

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.cpp
# Opt level: O1

void __thiscall
deci::parser_t::stack_symbol_type::stack_symbol_type
          (stack_symbol_type *this,state_type s,symbol_type *that)

{
  value_type *this_00;
  value_type *this_01;
  symbol_kind_type sVar1;
  filename_type *pfVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  counter_type cVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *u;
  
  (this->super_basic_symbol<deci::parser_t::by_state>).super_by_state.state = s;
  *(undefined8 *)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 8) = 0
  ;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 0x10)
       = 0;
  *(undefined8 *)((long)&(this->super_basic_symbol<deci::parser_t::by_state>).value.field_0 + 0x18)
       = 0;
  (this->super_basic_symbol<deci::parser_t::by_state>).value.yytypeid_ = (type_info *)0x0;
  pfVar2 = (that->super_basic_symbol<deci::parser_t::by_kind>).location.begin.filename;
  cVar5 = (that->super_basic_symbol<deci::parser_t::by_kind>).location.begin.line;
  cVar6 = (that->super_basic_symbol<deci::parser_t::by_kind>).location.begin.column;
  cVar3 = (that->super_basic_symbol<deci::parser_t::by_kind>).location.end.line;
  cVar4 = (that->super_basic_symbol<deci::parser_t::by_kind>).location.end.column;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.filename =
       (that->super_basic_symbol<deci::parser_t::by_kind>).location.end.filename;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.line = cVar3;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.end.column = cVar4;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.filename = pfVar2;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.line = cVar5;
  (this->super_basic_symbol<deci::parser_t::by_state>).location.begin.column = cVar6;
  sVar1 = (that->super_basic_symbol<deci::parser_t::by_kind>).super_by_kind.kind_;
  if ((uint)(sVar1 + ~S_YYUNDEF) < 0x42) {
    this_00 = &(this->super_basic_symbol<deci::parser_t::by_state>).value;
    switch(sVar1) {
    case S_NUMBER:
      value_type::move<double>(this_00,&(that->super_basic_symbol<deci::parser_t::by_kind>).value);
      break;
    case S_IDENTIFIER:
    case S_CMP_OPERATOR:
      this_01 = &(that->super_basic_symbol<deci::parser_t::by_kind>).value;
      u = value_type::as<std::__cxx11::string>(this_01);
      value_type::emplace<std::__cxx11::string,std::__cxx11::string>(this_00,u);
      value_type::destroy<std::__cxx11::string>(this_01);
      break;
    case S_42_argument_list_:
    case S_argument_list:
      value_type::move<deci::ast_arg_list_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_kind>).value);
      break;
    case S_43_statement_list_:
    case S_statement_list:
      value_type::move<deci::ast_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_kind>).value);
      break;
    case S_statement:
    case S_expression_statement:
    case S_expression:
    case S_assign_expr:
    case S_or_expr:
    case S_xor_expr:
    case S_and_expr:
    case S_eql_expr:
    case S_cmp_expr:
    case S_add_expr:
    case S_mul_expr:
    case S_pow_expr:
    case S_unary_expr:
    case S_postfix_expr:
    case S_primary_expr:
    case S_if_statement:
    case S_for_statement:
    case S_while_statement:
    case S_repeat_statement:
      value_type::move<deci::ast_item_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_kind>).value);
      break;
    case S_exit_statement:
      value_type::move<deci::ast_exit_t*>
                (this_00,&(that->super_basic_symbol<deci::parser_t::by_kind>).value);
    }
  }
  (that->super_basic_symbol<deci::parser_t::by_kind>).super_by_kind.kind_ = S_YYEMPTY;
  return;
}

Assistant:

parser_t ::stack_symbol_type::stack_symbol_type (state_type s, YY_MOVE_REF (symbol_type) that)
    : super_type (s, YY_MOVE (that.location))
  {
    switch (that.kind ())
    {
      case symbol_kind::S_42_argument_list_: // "argument list"
      case symbol_kind::S_argument_list: // argument_list
        value.move< ast_arg_list_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_exit_statement: // exit_statement
        value.move< ast_exit_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_statement: // statement
      case symbol_kind::S_expression_statement: // expression_statement
      case symbol_kind::S_expression: // expression
      case symbol_kind::S_assign_expr: // assign_expr
      case symbol_kind::S_or_expr: // or_expr
      case symbol_kind::S_xor_expr: // xor_expr
      case symbol_kind::S_and_expr: // and_expr
      case symbol_kind::S_eql_expr: // eql_expr
      case symbol_kind::S_cmp_expr: // cmp_expr
      case symbol_kind::S_add_expr: // add_expr
      case symbol_kind::S_mul_expr: // mul_expr
      case symbol_kind::S_pow_expr: // pow_expr
      case symbol_kind::S_unary_expr: // unary_expr
      case symbol_kind::S_postfix_expr: // postfix_expr
      case symbol_kind::S_primary_expr: // primary_expr
      case symbol_kind::S_if_statement: // if_statement
      case symbol_kind::S_for_statement: // for_statement
      case symbol_kind::S_while_statement: // while_statement
      case symbol_kind::S_repeat_statement: // repeat_statement
        value.move< ast_item_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_43_statement_list_: // "statement list"
      case symbol_kind::S_statement_list: // statement_list
        value.move< ast_t* > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_NUMBER: // "number"
        value.move< double > (YY_MOVE (that.value));
        break;

      case symbol_kind::S_IDENTIFIER: // "identifier"
      case symbol_kind::S_CMP_OPERATOR: // CMP_OPERATOR
        value.move< std::string > (YY_MOVE (that.value));
        break;

      default:
        break;
    }

    // that is emptied.
    that.kind_ = symbol_kind::S_YYEMPTY;
  }